

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int mbedtls_aes_self_test(int verbose)

{
  uchar auVar1 [16];
  int iVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [11];
  undefined1 auVar14 [11];
  undefined1 auVar15 [11];
  undefined1 auVar16 [11];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [13];
  undefined1 auVar22 [13];
  undefined1 auVar23 [13];
  undefined1 auVar24 [13];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  undefined1 auVar27 [14];
  undefined1 auVar28 [14];
  int iVar29;
  uint uVar30;
  char *pcVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar46;
  byte bVar47;
  uchar tmp [16];
  mbedtls_aes_context ctx;
  uchar stream_block [16];
  uchar nonce_counter [16];
  size_t sStack_b0;
  int len;
  size_t offset;
  uchar prv [16];
  uchar iv [16];
  uchar buf [64];
  uchar key [32];
  int v;
  int u;
  int j;
  int i;
  int ret;
  int verbose_local;
  
  memset(buf + 0x38,0,0x20);
  mbedtls_aes_init((mbedtls_aes_context *)(tmp + 8));
  for (u = 0; u < 6; u = u + 1) {
    iVar29 = u >> 1;
    uVar30 = u & 1;
    if (verbose != 0) {
      pcVar31 = "enc";
      if (uVar30 == 0) {
        pcVar31 = "dec";
      }
      printf("  AES-ECB-%3d (%s): ",(ulong)(iVar29 * 0x40 + 0x80),pcVar31);
    }
    memset(iv + 8,0,0x10);
    if (uVar30 == 0) {
      mbedtls_aes_setkey_dec((mbedtls_aes_context *)(tmp + 8),buf + 0x38,iVar29 * 0x40 + 0x80);
      for (v = 0; v < 10000; v = v + 1) {
        mbedtls_aes_crypt_ecb((mbedtls_aes_context *)(tmp + 8),0,iv + 8,iv + 8);
      }
      auVar1 = aes_test_ecb_dec[iVar29];
      cVar32 = -(iv[8] == auVar1[0]);
      cVar33 = -(iv[9] == auVar1[1]);
      cVar34 = -(iv[10] == auVar1[2]);
      cVar35 = -(iv[0xb] == auVar1[3]);
      cVar36 = -(iv[0xc] == auVar1[4]);
      cVar37 = -(iv[0xd] == auVar1[5]);
      cVar38 = -(iv[0xe] == auVar1[6]);
      cVar39 = -(iv[0xf] == auVar1[7]);
      cVar40 = -(buf[0] == auVar1[8]);
      cVar41 = -(buf[1] == auVar1[9]);
      cVar42 = -(buf[2] == auVar1[10]);
      cVar43 = -(buf[3] == auVar1[0xb]);
      cVar44 = -(buf[4] == auVar1[0xc]);
      cVar45 = -(buf[5] == auVar1[0xd]);
      cVar46 = -(buf[6] == auVar1[0xe]);
      bVar47 = -(buf[7] == auVar1[0xf]);
      auVar5[1] = cVar33;
      auVar5[0] = cVar32;
      auVar5[2] = cVar34;
      auVar5[3] = cVar35;
      auVar5[4] = cVar36;
      auVar5[5] = cVar37;
      auVar5[6] = cVar38;
      auVar5[7] = cVar39;
      auVar5[8] = cVar40;
      auVar5[9] = cVar41;
      auVar5[10] = cVar42;
      auVar5[0xb] = cVar43;
      auVar5[0xc] = cVar44;
      auVar5[0xd] = cVar45;
      auVar5[0xe] = cVar46;
      auVar5[0xf] = bVar47;
      auVar6[1] = cVar33;
      auVar6[0] = cVar32;
      auVar6[2] = cVar34;
      auVar6[3] = cVar35;
      auVar6[4] = cVar36;
      auVar6[5] = cVar37;
      auVar6[6] = cVar38;
      auVar6[7] = cVar39;
      auVar6[8] = cVar40;
      auVar6[9] = cVar41;
      auVar6[10] = cVar42;
      auVar6[0xb] = cVar43;
      auVar6[0xc] = cVar44;
      auVar6[0xd] = cVar45;
      auVar6[0xe] = cVar46;
      auVar6[0xf] = bVar47;
      auVar25[1] = cVar35;
      auVar25[0] = cVar34;
      auVar25[2] = cVar36;
      auVar25[3] = cVar37;
      auVar25[4] = cVar38;
      auVar25[5] = cVar39;
      auVar25[6] = cVar40;
      auVar25[7] = cVar41;
      auVar25[8] = cVar42;
      auVar25[9] = cVar43;
      auVar25[10] = cVar44;
      auVar25[0xb] = cVar45;
      auVar25[0xc] = cVar46;
      auVar25[0xd] = bVar47;
      auVar21[1] = cVar36;
      auVar21[0] = cVar35;
      auVar21[2] = cVar37;
      auVar21[3] = cVar38;
      auVar21[4] = cVar39;
      auVar21[5] = cVar40;
      auVar21[6] = cVar41;
      auVar21[7] = cVar42;
      auVar21[8] = cVar43;
      auVar21[9] = cVar44;
      auVar21[10] = cVar45;
      auVar21[0xb] = cVar46;
      auVar21[0xc] = bVar47;
      auVar17[1] = cVar37;
      auVar17[0] = cVar36;
      auVar17[2] = cVar38;
      auVar17[3] = cVar39;
      auVar17[4] = cVar40;
      auVar17[5] = cVar41;
      auVar17[6] = cVar42;
      auVar17[7] = cVar43;
      auVar17[8] = cVar44;
      auVar17[9] = cVar45;
      auVar17[10] = cVar46;
      auVar17[0xb] = bVar47;
      auVar13[1] = cVar38;
      auVar13[0] = cVar37;
      auVar13[2] = cVar39;
      auVar13[3] = cVar40;
      auVar13[4] = cVar41;
      auVar13[5] = cVar42;
      auVar13[6] = cVar43;
      auVar13[7] = cVar44;
      auVar13[8] = cVar45;
      auVar13[9] = cVar46;
      auVar13[10] = bVar47;
      if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar25 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar21 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar17 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar13 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar47,CONCAT18(cVar46,CONCAT17(cVar45,CONCAT16(cVar44,
                                                  CONCAT15(cVar43,CONCAT14(cVar42,CONCAT13(cVar41,
                                                  CONCAT12(cVar40,CONCAT11(cVar39,cVar38))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar47,CONCAT17(cVar46,CONCAT16(cVar45,CONCAT15(cVar44,
                                                  CONCAT14(cVar43,CONCAT13(cVar42,CONCAT12(cVar41,
                                                  CONCAT11(cVar40,cVar39)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar47 >> 7) << 0xf) != 0xffff) {
        if (verbose != 0) {
          printf("failed\n");
        }
        j = 1;
        goto LAB_0018b64a;
      }
    }
    else {
      mbedtls_aes_setkey_enc((mbedtls_aes_context *)(tmp + 8),buf + 0x38,iVar29 * 0x40 + 0x80);
      for (v = 0; v < 10000; v = v + 1) {
        mbedtls_aes_crypt_ecb((mbedtls_aes_context *)(tmp + 8),uVar30,iv + 8,iv + 8);
      }
      auVar1 = aes_test_ecb_enc[iVar29];
      cVar32 = -(iv[8] == auVar1[0]);
      cVar33 = -(iv[9] == auVar1[1]);
      cVar34 = -(iv[10] == auVar1[2]);
      cVar35 = -(iv[0xb] == auVar1[3]);
      cVar36 = -(iv[0xc] == auVar1[4]);
      cVar37 = -(iv[0xd] == auVar1[5]);
      cVar38 = -(iv[0xe] == auVar1[6]);
      cVar39 = -(iv[0xf] == auVar1[7]);
      cVar40 = -(buf[0] == auVar1[8]);
      cVar41 = -(buf[1] == auVar1[9]);
      cVar42 = -(buf[2] == auVar1[10]);
      cVar43 = -(buf[3] == auVar1[0xb]);
      cVar44 = -(buf[4] == auVar1[0xc]);
      cVar45 = -(buf[5] == auVar1[0xd]);
      cVar46 = -(buf[6] == auVar1[0xe]);
      bVar47 = -(buf[7] == auVar1[0xf]);
      auVar7[1] = cVar33;
      auVar7[0] = cVar32;
      auVar7[2] = cVar34;
      auVar7[3] = cVar35;
      auVar7[4] = cVar36;
      auVar7[5] = cVar37;
      auVar7[6] = cVar38;
      auVar7[7] = cVar39;
      auVar7[8] = cVar40;
      auVar7[9] = cVar41;
      auVar7[10] = cVar42;
      auVar7[0xb] = cVar43;
      auVar7[0xc] = cVar44;
      auVar7[0xd] = cVar45;
      auVar7[0xe] = cVar46;
      auVar7[0xf] = bVar47;
      auVar8[1] = cVar33;
      auVar8[0] = cVar32;
      auVar8[2] = cVar34;
      auVar8[3] = cVar35;
      auVar8[4] = cVar36;
      auVar8[5] = cVar37;
      auVar8[6] = cVar38;
      auVar8[7] = cVar39;
      auVar8[8] = cVar40;
      auVar8[9] = cVar41;
      auVar8[10] = cVar42;
      auVar8[0xb] = cVar43;
      auVar8[0xc] = cVar44;
      auVar8[0xd] = cVar45;
      auVar8[0xe] = cVar46;
      auVar8[0xf] = bVar47;
      auVar26[1] = cVar35;
      auVar26[0] = cVar34;
      auVar26[2] = cVar36;
      auVar26[3] = cVar37;
      auVar26[4] = cVar38;
      auVar26[5] = cVar39;
      auVar26[6] = cVar40;
      auVar26[7] = cVar41;
      auVar26[8] = cVar42;
      auVar26[9] = cVar43;
      auVar26[10] = cVar44;
      auVar26[0xb] = cVar45;
      auVar26[0xc] = cVar46;
      auVar26[0xd] = bVar47;
      auVar22[1] = cVar36;
      auVar22[0] = cVar35;
      auVar22[2] = cVar37;
      auVar22[3] = cVar38;
      auVar22[4] = cVar39;
      auVar22[5] = cVar40;
      auVar22[6] = cVar41;
      auVar22[7] = cVar42;
      auVar22[8] = cVar43;
      auVar22[9] = cVar44;
      auVar22[10] = cVar45;
      auVar22[0xb] = cVar46;
      auVar22[0xc] = bVar47;
      auVar18[1] = cVar37;
      auVar18[0] = cVar36;
      auVar18[2] = cVar38;
      auVar18[3] = cVar39;
      auVar18[4] = cVar40;
      auVar18[5] = cVar41;
      auVar18[6] = cVar42;
      auVar18[7] = cVar43;
      auVar18[8] = cVar44;
      auVar18[9] = cVar45;
      auVar18[10] = cVar46;
      auVar18[0xb] = bVar47;
      auVar14[1] = cVar38;
      auVar14[0] = cVar37;
      auVar14[2] = cVar39;
      auVar14[3] = cVar40;
      auVar14[4] = cVar41;
      auVar14[5] = cVar42;
      auVar14[6] = cVar43;
      auVar14[7] = cVar44;
      auVar14[8] = cVar45;
      auVar14[9] = cVar46;
      auVar14[10] = bVar47;
      if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar26 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar22 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar18 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar14 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar47,CONCAT18(cVar46,CONCAT17(cVar45,CONCAT16(cVar44,
                                                  CONCAT15(cVar43,CONCAT14(cVar42,CONCAT13(cVar41,
                                                  CONCAT12(cVar40,CONCAT11(cVar39,cVar38))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar47,CONCAT17(cVar46,CONCAT16(cVar45,CONCAT15(cVar44,
                                                  CONCAT14(cVar43,CONCAT13(cVar42,CONCAT12(cVar41,
                                                  CONCAT11(cVar40,cVar39)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar47 >> 7) << 0xf) != 0xffff) {
        if (verbose != 0) {
          printf("failed\n");
        }
        j = 1;
        goto LAB_0018b64a;
      }
    }
    if (verbose != 0) {
      printf("passed\n");
    }
  }
  if (verbose != 0) {
    printf(anon_var_dwarf_940d1 + 8);
  }
  for (u = 0; u < 6; u = u + 1) {
    iVar29 = u >> 1;
    uVar30 = u & 1;
    if (verbose != 0) {
      pcVar31 = "enc";
      if (uVar30 == 0) {
        pcVar31 = "dec";
      }
      printf("  AES-CBC-%3d (%s): ",(ulong)(iVar29 * 0x40 + 0x80),pcVar31);
    }
    memset(prv + 8,0,0x10);
    memset(&offset,0,0x10);
    memset(iv + 8,0,0x10);
    if (uVar30 == 0) {
      mbedtls_aes_setkey_dec((mbedtls_aes_context *)(tmp + 8),buf + 0x38,iVar29 * 0x40 + 0x80);
      for (v = 0; v < 10000; v = v + 1) {
        mbedtls_aes_crypt_cbc((mbedtls_aes_context *)(tmp + 8),0,0x10,prv + 8,iv + 8,iv + 8);
      }
      auVar1 = aes_test_cbc_dec[iVar29];
      cVar32 = -(iv[8] == auVar1[0]);
      cVar33 = -(iv[9] == auVar1[1]);
      cVar34 = -(iv[10] == auVar1[2]);
      cVar35 = -(iv[0xb] == auVar1[3]);
      cVar36 = -(iv[0xc] == auVar1[4]);
      cVar37 = -(iv[0xd] == auVar1[5]);
      cVar38 = -(iv[0xe] == auVar1[6]);
      cVar39 = -(iv[0xf] == auVar1[7]);
      cVar40 = -(buf[0] == auVar1[8]);
      cVar41 = -(buf[1] == auVar1[9]);
      cVar42 = -(buf[2] == auVar1[10]);
      cVar43 = -(buf[3] == auVar1[0xb]);
      cVar44 = -(buf[4] == auVar1[0xc]);
      cVar45 = -(buf[5] == auVar1[0xd]);
      cVar46 = -(buf[6] == auVar1[0xe]);
      bVar47 = -(buf[7] == auVar1[0xf]);
      auVar9[1] = cVar33;
      auVar9[0] = cVar32;
      auVar9[2] = cVar34;
      auVar9[3] = cVar35;
      auVar9[4] = cVar36;
      auVar9[5] = cVar37;
      auVar9[6] = cVar38;
      auVar9[7] = cVar39;
      auVar9[8] = cVar40;
      auVar9[9] = cVar41;
      auVar9[10] = cVar42;
      auVar9[0xb] = cVar43;
      auVar9[0xc] = cVar44;
      auVar9[0xd] = cVar45;
      auVar9[0xe] = cVar46;
      auVar9[0xf] = bVar47;
      auVar10[1] = cVar33;
      auVar10[0] = cVar32;
      auVar10[2] = cVar34;
      auVar10[3] = cVar35;
      auVar10[4] = cVar36;
      auVar10[5] = cVar37;
      auVar10[6] = cVar38;
      auVar10[7] = cVar39;
      auVar10[8] = cVar40;
      auVar10[9] = cVar41;
      auVar10[10] = cVar42;
      auVar10[0xb] = cVar43;
      auVar10[0xc] = cVar44;
      auVar10[0xd] = cVar45;
      auVar10[0xe] = cVar46;
      auVar10[0xf] = bVar47;
      auVar27[1] = cVar35;
      auVar27[0] = cVar34;
      auVar27[2] = cVar36;
      auVar27[3] = cVar37;
      auVar27[4] = cVar38;
      auVar27[5] = cVar39;
      auVar27[6] = cVar40;
      auVar27[7] = cVar41;
      auVar27[8] = cVar42;
      auVar27[9] = cVar43;
      auVar27[10] = cVar44;
      auVar27[0xb] = cVar45;
      auVar27[0xc] = cVar46;
      auVar27[0xd] = bVar47;
      auVar23[1] = cVar36;
      auVar23[0] = cVar35;
      auVar23[2] = cVar37;
      auVar23[3] = cVar38;
      auVar23[4] = cVar39;
      auVar23[5] = cVar40;
      auVar23[6] = cVar41;
      auVar23[7] = cVar42;
      auVar23[8] = cVar43;
      auVar23[9] = cVar44;
      auVar23[10] = cVar45;
      auVar23[0xb] = cVar46;
      auVar23[0xc] = bVar47;
      auVar19[1] = cVar37;
      auVar19[0] = cVar36;
      auVar19[2] = cVar38;
      auVar19[3] = cVar39;
      auVar19[4] = cVar40;
      auVar19[5] = cVar41;
      auVar19[6] = cVar42;
      auVar19[7] = cVar43;
      auVar19[8] = cVar44;
      auVar19[9] = cVar45;
      auVar19[10] = cVar46;
      auVar19[0xb] = bVar47;
      auVar15[1] = cVar38;
      auVar15[0] = cVar37;
      auVar15[2] = cVar39;
      auVar15[3] = cVar40;
      auVar15[4] = cVar41;
      auVar15[5] = cVar42;
      auVar15[6] = cVar43;
      auVar15[7] = cVar44;
      auVar15[8] = cVar45;
      auVar15[9] = cVar46;
      auVar15[10] = bVar47;
      if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar27 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar23 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar19 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar15 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar47,CONCAT18(cVar46,CONCAT17(cVar45,CONCAT16(cVar44,
                                                  CONCAT15(cVar43,CONCAT14(cVar42,CONCAT13(cVar41,
                                                  CONCAT12(cVar40,CONCAT11(cVar39,cVar38))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar47,CONCAT17(cVar46,CONCAT16(cVar45,CONCAT15(cVar44,
                                                  CONCAT14(cVar43,CONCAT13(cVar42,CONCAT12(cVar41,
                                                  CONCAT11(cVar40,cVar39)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar47 >> 7) << 0xf) != 0xffff) {
        if (verbose != 0) {
          printf("failed\n");
        }
        j = 1;
        goto LAB_0018b64a;
      }
    }
    else {
      mbedtls_aes_setkey_enc((mbedtls_aes_context *)(tmp + 8),buf + 0x38,iVar29 * 0x40 + 0x80);
      for (v = 0; v < 10000; v = v + 1) {
        mbedtls_aes_crypt_cbc((mbedtls_aes_context *)(tmp + 8),uVar30,0x10,prv + 8,iv + 8,iv + 8);
        sVar3._0_1_ = iv[8];
        sVar3._1_1_ = iv[9];
        sVar3._2_1_ = iv[10];
        sVar3._3_1_ = iv[0xb];
        sVar3._4_1_ = iv[0xc];
        sVar3._5_1_ = iv[0xd];
        sVar3._6_1_ = iv[0xe];
        sVar3._7_1_ = iv[0xf];
        uVar4._0_1_ = buf[0];
        uVar4._1_1_ = buf[1];
        uVar4._2_1_ = buf[2];
        uVar4._3_1_ = buf[3];
        uVar4._4_1_ = buf[4];
        uVar4._5_1_ = buf[5];
        uVar4._6_1_ = buf[6];
        uVar4._7_1_ = buf[7];
        iv._8_8_ = offset;
        buf[0] = prv[0];
        buf[1] = prv[1];
        buf[2] = prv[2];
        buf[3] = prv[3];
        buf[4] = prv[4];
        buf[5] = prv[5];
        buf[6] = prv[6];
        buf[7] = prv[7];
        offset = sVar3;
        prv._0_8_ = uVar4;
      }
      auVar1 = aes_test_cbc_enc[iVar29];
      cVar32 = -((uchar)offset == auVar1[0]);
      cVar33 = -(offset._1_1_ == auVar1[1]);
      cVar34 = -(offset._2_1_ == auVar1[2]);
      cVar35 = -(offset._3_1_ == auVar1[3]);
      cVar36 = -(offset._4_1_ == auVar1[4]);
      cVar37 = -(offset._5_1_ == auVar1[5]);
      cVar38 = -(offset._6_1_ == auVar1[6]);
      cVar39 = -(offset._7_1_ == auVar1[7]);
      cVar40 = -(prv[0] == auVar1[8]);
      cVar41 = -(prv[1] == auVar1[9]);
      cVar42 = -(prv[2] == auVar1[10]);
      cVar43 = -(prv[3] == auVar1[0xb]);
      cVar44 = -(prv[4] == auVar1[0xc]);
      cVar45 = -(prv[5] == auVar1[0xd]);
      cVar46 = -(prv[6] == auVar1[0xe]);
      bVar47 = -(prv[7] == auVar1[0xf]);
      auVar11[1] = cVar33;
      auVar11[0] = cVar32;
      auVar11[2] = cVar34;
      auVar11[3] = cVar35;
      auVar11[4] = cVar36;
      auVar11[5] = cVar37;
      auVar11[6] = cVar38;
      auVar11[7] = cVar39;
      auVar11[8] = cVar40;
      auVar11[9] = cVar41;
      auVar11[10] = cVar42;
      auVar11[0xb] = cVar43;
      auVar11[0xc] = cVar44;
      auVar11[0xd] = cVar45;
      auVar11[0xe] = cVar46;
      auVar11[0xf] = bVar47;
      auVar12[1] = cVar33;
      auVar12[0] = cVar32;
      auVar12[2] = cVar34;
      auVar12[3] = cVar35;
      auVar12[4] = cVar36;
      auVar12[5] = cVar37;
      auVar12[6] = cVar38;
      auVar12[7] = cVar39;
      auVar12[8] = cVar40;
      auVar12[9] = cVar41;
      auVar12[10] = cVar42;
      auVar12[0xb] = cVar43;
      auVar12[0xc] = cVar44;
      auVar12[0xd] = cVar45;
      auVar12[0xe] = cVar46;
      auVar12[0xf] = bVar47;
      auVar28[1] = cVar35;
      auVar28[0] = cVar34;
      auVar28[2] = cVar36;
      auVar28[3] = cVar37;
      auVar28[4] = cVar38;
      auVar28[5] = cVar39;
      auVar28[6] = cVar40;
      auVar28[7] = cVar41;
      auVar28[8] = cVar42;
      auVar28[9] = cVar43;
      auVar28[10] = cVar44;
      auVar28[0xb] = cVar45;
      auVar28[0xc] = cVar46;
      auVar28[0xd] = bVar47;
      auVar24[1] = cVar36;
      auVar24[0] = cVar35;
      auVar24[2] = cVar37;
      auVar24[3] = cVar38;
      auVar24[4] = cVar39;
      auVar24[5] = cVar40;
      auVar24[6] = cVar41;
      auVar24[7] = cVar42;
      auVar24[8] = cVar43;
      auVar24[9] = cVar44;
      auVar24[10] = cVar45;
      auVar24[0xb] = cVar46;
      auVar24[0xc] = bVar47;
      auVar20[1] = cVar37;
      auVar20[0] = cVar36;
      auVar20[2] = cVar38;
      auVar20[3] = cVar39;
      auVar20[4] = cVar40;
      auVar20[5] = cVar41;
      auVar20[6] = cVar42;
      auVar20[7] = cVar43;
      auVar20[8] = cVar44;
      auVar20[9] = cVar45;
      auVar20[10] = cVar46;
      auVar20[0xb] = bVar47;
      auVar16[1] = cVar38;
      auVar16[0] = cVar37;
      auVar16[2] = cVar39;
      auVar16[3] = cVar40;
      auVar16[4] = cVar41;
      auVar16[5] = cVar42;
      auVar16[6] = cVar43;
      auVar16[7] = cVar44;
      auVar16[8] = cVar45;
      auVar16[9] = cVar46;
      auVar16[10] = bVar47;
      if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB141(auVar28 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar24 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar20 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar16 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar47,CONCAT18(cVar46,CONCAT17(cVar45,CONCAT16(cVar44,
                                                  CONCAT15(cVar43,CONCAT14(cVar42,CONCAT13(cVar41,
                                                  CONCAT12(cVar40,CONCAT11(cVar39,cVar38))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar47,CONCAT17(cVar46,CONCAT16(cVar45,CONCAT15(cVar44,
                                                  CONCAT14(cVar43,CONCAT13(cVar42,CONCAT12(cVar41,
                                                  CONCAT11(cVar40,cVar39)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar47 >> 7) << 0xf) != 0xffff) {
        if (verbose != 0) {
          printf("failed\n");
        }
        j = 1;
        goto LAB_0018b64a;
      }
    }
    if (verbose != 0) {
      printf("passed\n");
    }
  }
  if (verbose != 0) {
    printf(anon_var_dwarf_940d1 + 8);
  }
  for (u = 0; u < 6; u = u + 1) {
    iVar29 = u >> 1;
    uVar30 = u & 1;
    if (verbose != 0) {
      pcVar31 = "enc";
      if (uVar30 == 0) {
        pcVar31 = "dec";
      }
      printf("  AES-CFB128-%3d (%s): ",(ulong)(iVar29 * 0x40 + 0x80),pcVar31);
    }
    prv[8] = '\0';
    prv[9] = '\x01';
    prv[10] = '\x02';
    prv[0xb] = '\x03';
    prv[0xc] = '\x04';
    prv[0xd] = '\x05';
    prv[0xe] = '\x06';
    prv[0xf] = '\a';
    builtin_memcpy(iv,"\b\t\n\v\f\r\x0e\x0f",8);
    memcpy(buf + 0x38,aes_test_cfb128_key + iVar29,(long)(iVar29 * 8 + 0x10));
    sStack_b0 = 0;
    mbedtls_aes_setkey_enc((mbedtls_aes_context *)(tmp + 8),buf + 0x38,iVar29 * 0x40 + 0x80);
    if (uVar30 == 0) {
      memcpy(iv + 8,aes_test_cfb128_ct + iVar29,0x40);
      mbedtls_aes_crypt_cfb128
                ((mbedtls_aes_context *)(tmp + 8),0,0x40,&stack0xffffffffffffff50,prv + 8,iv + 8,
                 iv + 8);
      iVar29 = memcmp(iv + 8,aes_test_cfb128_pt,0x40);
      if (iVar29 != 0) {
        if (verbose != 0) {
          printf("failed\n");
        }
        j = 1;
        goto LAB_0018b64a;
      }
    }
    else {
      memcpy(iv + 8,aes_test_cfb128_pt,0x40);
      mbedtls_aes_crypt_cfb128
                ((mbedtls_aes_context *)(tmp + 8),uVar30,0x40,&stack0xffffffffffffff50,prv + 8,
                 iv + 8,iv + 8);
      iVar29 = memcmp(iv + 8,aes_test_cfb128_ct + iVar29,0x40);
      if (iVar29 != 0) {
        if (verbose != 0) {
          printf("failed\n");
        }
        j = 1;
        goto LAB_0018b64a;
      }
    }
    if (verbose != 0) {
      printf("passed\n");
    }
  }
  if (verbose != 0) {
    printf(anon_var_dwarf_940d1 + 8);
  }
  u = 0;
  do {
    if (5 < u) {
      if (verbose != 0) {
        printf(anon_var_dwarf_940d1 + 8);
      }
      j = 0;
LAB_0018b64a:
      mbedtls_aes_free((mbedtls_aes_context *)(tmp + 8));
      return j;
    }
    iVar29 = u >> 1;
    if (verbose != 0) {
      pcVar31 = "enc";
      if ((u & 1U) == 0) {
        pcVar31 = "dec";
      }
      printf("  AES-CTR-128 (%s): ",pcVar31);
    }
    stream_block._8_8_ = *(undefined8 *)aes_test_ctr_nonce_counter[iVar29];
    buf._56_8_ = *(undefined8 *)aes_test_ctr_key[iVar29];
    sStack_b0 = 0;
    mbedtls_aes_setkey_enc((mbedtls_aes_context *)(tmp + 8),buf + 0x38,0x80);
    if ((u & 1U) == 0) {
      iVar2 = aes_test_ctr_len[iVar29];
      memcpy(iv + 8,aes_test_ctr_ct + iVar29,(long)iVar2);
      mbedtls_aes_crypt_ctr
                ((mbedtls_aes_context *)(tmp + 8),(long)iVar2,&stack0xffffffffffffff50,
                 stream_block + 8,(uchar *)(ctx.buf + 0x42),iv + 8,iv + 8);
      iVar29 = memcmp(iv + 8,aes_test_ctr_pt + iVar29,(long)iVar2);
      if (iVar29 != 0) {
        if (verbose != 0) {
          printf("failed\n");
        }
        j = 1;
        goto LAB_0018b64a;
      }
    }
    else {
      iVar2 = aes_test_ctr_len[iVar29];
      memcpy(iv + 8,aes_test_ctr_pt + iVar29,(long)iVar2);
      mbedtls_aes_crypt_ctr
                ((mbedtls_aes_context *)(tmp + 8),(long)iVar2,&stack0xffffffffffffff50,
                 stream_block + 8,(uchar *)(ctx.buf + 0x42),iv + 8,iv + 8);
      iVar29 = memcmp(iv + 8,aes_test_ctr_ct + iVar29,(long)iVar2);
      if (iVar29 != 0) {
        if (verbose != 0) {
          printf("failed\n");
        }
        j = 1;
        goto LAB_0018b64a;
      }
    }
    if (verbose != 0) {
      printf("passed\n");
    }
    u = u + 1;
  } while( true );
}

Assistant:

int mbedtls_aes_self_test( int verbose )
{
    int ret = 0, i, j, u, v;
    unsigned char key[32];
    unsigned char buf[64];
    unsigned char iv[16];
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char prv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR) || defined(MBEDTLS_CIPHER_MODE_CFB)
    size_t offset;
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR)
    int len;
    unsigned char nonce_counter[16];
    unsigned char stream_block[16];
#endif
    mbedtls_aes_context ctx;

    memset( key, 0, 32 );
    mbedtls_aes_init( &ctx );

    /*
     * ECB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-ECB-%3d (%s): ", 128 + u * 64,
                             ( v == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( buf, 0, 16 );

        if( v == MBEDTLS_AES_DECRYPT )
        {
            mbedtls_aes_setkey_dec( &ctx, key, 128 + u * 64 );

            for( j = 0; j < 10000; j++ )
                mbedtls_aes_crypt_ecb( &ctx, v, buf, buf );

            if( memcmp( buf, aes_test_ecb_dec[u], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }
        else
        {
            mbedtls_aes_setkey_enc( &ctx, key, 128 + u * 64 );

            for( j = 0; j < 10000; j++ )
                mbedtls_aes_crypt_ecb( &ctx, v, buf, buf );

            if( memcmp( buf, aes_test_ecb_enc[u], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CBC-%3d (%s): ", 128 + u * 64,
                             ( v == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( iv , 0, 16 );
        memset( prv, 0, 16 );
        memset( buf, 0, 16 );

        if( v == MBEDTLS_AES_DECRYPT )
        {
            mbedtls_aes_setkey_dec( &ctx, key, 128 + u * 64 );

            for( j = 0; j < 10000; j++ )
                mbedtls_aes_crypt_cbc( &ctx, v, 16, iv, buf, buf );

            if( memcmp( buf, aes_test_cbc_dec[u], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }
        else
        {
            mbedtls_aes_setkey_enc( &ctx, key, 128 + u * 64 );

            for( j = 0; j < 10000; j++ )
            {
                unsigned char tmp[16];

                mbedtls_aes_crypt_cbc( &ctx, v, 16, iv, buf, buf );

                memcpy( tmp, prv, 16 );
                memcpy( prv, buf, 16 );
                memcpy( buf, tmp, 16 );
            }

            if( memcmp( prv, aes_test_cbc_enc[u], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CBC */

#if defined(MBEDTLS_CIPHER_MODE_CFB)
    /*
     * CFB128 mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CFB128-%3d (%s): ", 128 + u * 64,
                             ( v == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  aes_test_cfb128_iv, 16 );
        memcpy( key, aes_test_cfb128_key[u], 16 + u * 8 );

        offset = 0;
        mbedtls_aes_setkey_enc( &ctx, key, 128 + u * 64 );

        if( v == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_cfb128_ct[u], 64 );
            mbedtls_aes_crypt_cfb128( &ctx, v, 64, &offset, iv, buf, buf );

            if( memcmp( buf, aes_test_cfb128_pt, 64 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }
        else
        {
            memcpy( buf, aes_test_cfb128_pt, 64 );
            mbedtls_aes_crypt_cfb128( &ctx, v, 64, &offset, iv, buf, buf );

            if( memcmp( buf, aes_test_cfb128_ct[u], 64 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CFB */

#if defined(MBEDTLS_CIPHER_MODE_CTR)
    /*
     * CTR mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CTR-128 (%s): ",
                             ( v == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( nonce_counter, aes_test_ctr_nonce_counter[u], 16 );
        memcpy( key, aes_test_ctr_key[u], 16 );

        offset = 0;
        mbedtls_aes_setkey_enc( &ctx, key, 128 );

        if( v == MBEDTLS_AES_DECRYPT )
        {
            len = aes_test_ctr_len[u];
            memcpy( buf, aes_test_ctr_ct[u], len );

            mbedtls_aes_crypt_ctr( &ctx, len, &offset, nonce_counter, stream_block,
                           buf, buf );

            if( memcmp( buf, aes_test_ctr_pt[u], len ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }
        else
        {
            len = aes_test_ctr_len[u];
            memcpy( buf, aes_test_ctr_pt[u], len );

            mbedtls_aes_crypt_ctr( &ctx, len, &offset, nonce_counter, stream_block,
                           buf, buf );

            if( memcmp( buf, aes_test_ctr_ct[u], len ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CTR */

    ret = 0;

exit:
    mbedtls_aes_free( &ctx );

    return( ret );
}